

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LSTMWeightParams::SerializeWithCachedSizes
          (LSTMWeightParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  LSTMWeightParams *this_local;
  
  bVar1 = has_inputgateweightmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->inputgateweightmatrix_->super_MessageLite,output);
  }
  bVar1 = has_forgetgateweightmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->forgetgateweightmatrix_->super_MessageLite,output);
  }
  bVar1 = has_blockinputweightmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->blockinputweightmatrix_->super_MessageLite,output);
  }
  bVar1 = has_outputgateweightmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (4,&this->outputgateweightmatrix_->super_MessageLite,output);
  }
  bVar1 = has_inputgaterecursionmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&this->inputgaterecursionmatrix_->super_MessageLite,output);
  }
  bVar1 = has_forgetgaterecursionmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x15,&this->forgetgaterecursionmatrix_->super_MessageLite,output);
  }
  bVar1 = has_blockinputrecursionmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x16,&this->blockinputrecursionmatrix_->super_MessageLite,output);
  }
  bVar1 = has_outputgaterecursionmatrix(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x17,&this->outputgaterecursionmatrix_->super_MessageLite,output);
  }
  bVar1 = has_inputgatebiasvector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x28,&this->inputgatebiasvector_->super_MessageLite,output);
  }
  bVar1 = has_forgetgatebiasvector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x29,&this->forgetgatebiasvector_->super_MessageLite,output);
  }
  bVar1 = has_blockinputbiasvector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x2a,&this->blockinputbiasvector_->super_MessageLite,output);
  }
  bVar1 = has_outputgatebiasvector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x2b,&this->outputgatebiasvector_->super_MessageLite,output);
  }
  bVar1 = has_inputgatepeepholevector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x3c,&this->inputgatepeepholevector_->super_MessageLite,output);
  }
  bVar1 = has_forgetgatepeepholevector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x3d,&this->forgetgatepeepholevector_->super_MessageLite,output);
  }
  bVar1 = has_outputgatepeepholevector(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x3e,&this->outputgatepeepholevector_->super_MessageLite,output);
  }
  return;
}

Assistant:

void LSTMWeightParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LSTMWeightParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.WeightParams inputGateWeightMatrix = 1;
  if (this->has_inputgateweightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->inputgateweightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams forgetGateWeightMatrix = 2;
  if (this->has_forgetgateweightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->forgetgateweightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams blockInputWeightMatrix = 3;
  if (this->has_blockinputweightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->blockinputweightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams outputGateWeightMatrix = 4;
  if (this->has_outputgateweightmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      4, *this->outputgateweightmatrix_, output);
  }

  // .CoreML.Specification.WeightParams inputGateRecursionMatrix = 20;
  if (this->has_inputgaterecursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *this->inputgaterecursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams forgetGateRecursionMatrix = 21;
  if (this->has_forgetgaterecursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      21, *this->forgetgaterecursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams blockInputRecursionMatrix = 22;
  if (this->has_blockinputrecursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      22, *this->blockinputrecursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 23;
  if (this->has_outputgaterecursionmatrix()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      23, *this->outputgaterecursionmatrix_, output);
  }

  // .CoreML.Specification.WeightParams inputGateBiasVector = 40;
  if (this->has_inputgatebiasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      40, *this->inputgatebiasvector_, output);
  }

  // .CoreML.Specification.WeightParams forgetGateBiasVector = 41;
  if (this->has_forgetgatebiasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      41, *this->forgetgatebiasvector_, output);
  }

  // .CoreML.Specification.WeightParams blockInputBiasVector = 42;
  if (this->has_blockinputbiasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      42, *this->blockinputbiasvector_, output);
  }

  // .CoreML.Specification.WeightParams outputGateBiasVector = 43;
  if (this->has_outputgatebiasvector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      43, *this->outputgatebiasvector_, output);
  }

  // .CoreML.Specification.WeightParams inputGatePeepholeVector = 60;
  if (this->has_inputgatepeepholevector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      60, *this->inputgatepeepholevector_, output);
  }

  // .CoreML.Specification.WeightParams forgetGatePeepholeVector = 61;
  if (this->has_forgetgatepeepholevector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      61, *this->forgetgatepeepholevector_, output);
  }

  // .CoreML.Specification.WeightParams outputGatePeepholeVector = 62;
  if (this->has_outputgatepeepholevector()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      62, *this->outputgatepeepholevector_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LSTMWeightParams)
}